

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O2

int VP8LResidualImage(int width,int height,int min_bits,int max_bits,int low_effort,uint32_t *argb,
                     uint32_t *argb_scratch,uint32_t *image,int near_lossless_quality,int exact,
                     int used_subtract_green,WebPPicture *pic,int percent_range,int *percent,
                     int *best_bits)

{
  bool bVar1;
  int max_quantization;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint32_t *puVar6;
  uint32_t *puVar7;
  ulong uVar8;
  int64_t iVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  byte bVar12;
  byte bVar13;
  ulong uVar14;
  long lVar15;
  uint32_t **ppuVar16;
  int iVar17;
  uint32_t uVar18;
  int iVar19;
  int iVar20;
  uint32_t subsampling_index;
  int iVar21;
  uint uVar22;
  uint32_t *puVar23;
  uint32_t *puVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  long lVar34;
  uint uVar35;
  long lVar36;
  uint uVar37;
  int iVar38;
  long lVar39;
  uint local_a38;
  uint local_a34;
  uint32_t *local_a30;
  uint8_t *local_a20;
  uint32_t *local_a18;
  uint8_t *tmp8;
  uint32_t *local_a00;
  uint local_9e8;
  int local_9d4;
  uint local_9d0;
  ulong local_9c0;
  uint8_t *local_9b8;
  long local_9b0;
  int local_9a8;
  long local_980;
  uint64_t local_910;
  int local_8e0;
  uint32_t num_pixels [10];
  uint32_t *modes [10];
  uint32_t local_838 [514];
  
  iVar3 = *percent;
  max_quantization = 1 << ((char)(near_lossless_quality / -0x14) + 5U & 0x1f);
  if (low_effort != 0) {
    bVar12 = (byte)max_bits;
    local_9a8 = 1 << (bVar12 & 0x1f);
    local_9e8 = (width + local_9a8) - 1U >> (bVar12 & 0x1f);
    uVar2 = ((height + local_9a8) - 1U >> (bVar12 & 0x1f)) * local_9e8;
    uVar14 = 0;
    uVar8 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar8 = uVar14;
    }
    for (; uVar8 != uVar14; uVar14 = uVar14 + 1) {
      image[uVar14] = 0xff000b00;
    }
    *best_bits = max_bits;
LAB_0013a368:
    local_980 = (long)height;
    local_9b0 = (long)width;
    puVar6 = argb_scratch + local_9b0 + 1;
    tmp8 = (uint8_t *)(argb_scratch + local_9b0 * 2 + 2);
    uVar8 = 0;
    uVar14 = 0;
    if (0 < height) {
      uVar14 = (ulong)(uint)height;
    }
    local_a20 = (uint8_t *)((long)argb_scratch + local_9b0 * 9 + 8);
    do {
      puVar23 = (uint32_t *)((uVar8 + 1) * local_9b0 * 4 + (long)argb);
      local_a30 = (uint32_t *)(local_9b0 * 4 * uVar8 + (long)argb);
      puVar7 = puVar6;
      puVar6 = argb_scratch;
      while( true ) {
        argb_scratch = puVar7;
        if (uVar14 == uVar8) {
          iVar3 = WebPReportProgress(pic,iVar3 + percent_range,percent);
          return iVar3;
        }
        memcpy(puVar6,local_a30,(long)(int)((uint)((long)(uVar8 + 1) < local_980) + width) << 2);
        uVar2 = (uint)uVar8;
        if (low_effort == 0) break;
        PredictBatch(0xb,0,uVar2,width,puVar6,argb_scratch,local_a30);
        puVar23 = puVar23 + local_9b0;
        local_a30 = local_a30 + local_9b0;
        puVar7 = puVar6;
        uVar8 = uVar8 + 1;
        puVar6 = argb_scratch;
      }
      if (max_quantization < 2) {
        local_9b8 = local_a20;
      }
      else {
        if ((long)uVar8 < local_980 + -2) {
          MaxDiffsForRow(width,width,puVar23,tmp8,used_subtract_green);
        }
        local_9b8 = tmp8;
        tmp8 = local_a20;
      }
      uVar8 = uVar8 + 1;
      iVar4 = 0;
      while (iVar4 < width) {
        iVar28 = iVar4 + local_9a8;
        if (width <= iVar4 + local_9a8) {
          iVar28 = width;
        }
        GetResidual(width,height,argb_scratch,puVar6,tmp8,
                    (uint)*(byte *)((long)image +
                                   (long)(int)((iVar4 >> ((byte)max_bits & 0x1f)) +
                                              (uVar2 >> ((byte)max_bits & 0x1f)) * local_9e8) * 4 +
                                   1),iVar4,iVar28,uVar2,max_quantization,exact,used_subtract_green,
                    local_a30 + iVar4);
        iVar4 = iVar28;
      }
      local_a20 = local_9b8;
    } while( true );
  }
  iVar4 = width + -1;
  iVar28 = height + -1;
  uVar2 = 0;
  lVar36 = (long)min_bits;
  for (lVar15 = lVar36; lVar15 <= max_bits; lVar15 = lVar15 + 1) {
    bVar12 = (byte)lVar15;
    iVar17 = 1 << (bVar12 & 0x1f);
    uVar18 = ((uint)(iVar17 + iVar28) >> (bVar12 & 0x1f)) *
             ((uint)(iVar4 + iVar17) >> (bVar12 & 0x1f));
    num_pixels[lVar15] = uVar18;
    uVar2 = uVar18 + uVar2;
  }
  puVar6 = (uint32_t *)WebPSafeMalloc((ulong)uVar2,4);
  if (puVar6 != (uint32_t *)0x0) {
    ppuVar16 = modes + lVar36;
    *ppuVar16 = puVar6;
    puVar7 = puVar6;
    for (; lVar36 < max_bits; lVar36 = lVar36 + 1) {
      puVar7 = puVar7 + num_pixels[lVar36];
      modes[lVar36 + 1] = puVar7;
    }
    bVar12 = (byte)min_bits;
    uVar2 = 1 << (bVar12 & 0x1f);
    uVar37 = uVar2 + iVar28 >> (bVar12 & 0x1f);
    uVar33 = max_bits - min_bits;
    iVar21 = uVar33 + 1;
    puVar7 = (uint32_t *)WebPSafeCalloc((long)(iVar21 * 0x3c0e),4);
    iVar17 = *percent;
    iVar5 = 4;
    if (max_bits < 4) {
      iVar5 = max_bits;
    }
    iVar19 = min_bits;
    if (min_bits < iVar5) {
      iVar19 = iVar5;
    }
    *best_bits = 0;
    if (puVar7 != (uint32_t *)0x0) {
      local_910 = 0x7fffffffffffffff;
      lVar15 = (long)width;
      uVar26 = (uVar2 + iVar4 >> (bVar12 & 0x1f)) - 1;
      local_9d4 = 0;
      iVar38 = 0;
      local_a34 = 0;
      uVar25 = 0;
      local_a38 = 0;
      local_9d0 = 0;
      do {
        if (uVar37 <= uVar25) {
          iVar17 = 0;
          local_a00 = (uint32_t *)0x0;
          for (uVar2 = 0; uVar2 <= uVar33; uVar2 = uVar2 + 1) {
            uVar10 = (*VP8LShannonEntropy)
                               (puVar7 + (long)(iVar21 * 0x3800) +
                                         (long)(iVar21 * 0x400) + (ulong)(uVar2 * 0xe),0xe);
            for (lVar15 = 0; lVar15 != 0x1000; lVar15 = lVar15 + 0x400) {
              uVar11 = (*VP8LShannonEntropy)
                                 ((uint32_t *)
                                  ((long)puVar7 +
                                  lVar15 + (long)iVar17 * 4 + (long)(iVar21 * 0x3800) * 4),0x100);
              uVar10 = uVar10 + uVar11;
            }
            if ((long)uVar10 < (long)local_910) {
              *best_bits = min_bits + uVar2;
              local_a00 = ppuVar16[uVar2];
              local_910 = uVar10;
            }
            iVar17 = iVar17 + 0x400;
          }
          WebPSafeFree(puVar7);
          VP8LOptimizeSampling(local_a00,width,height,*best_bits,9,best_bits);
          goto LAB_0013b07a;
        }
        iVar20 = local_a34 << (bVar12 & 0x1f);
        iVar27 = uVar25 << (bVar12 & 0x1f);
        uVar29 = height - iVar27;
        if ((int)uVar2 < height - iVar27) {
          uVar29 = uVar2;
        }
        uVar35 = width - iVar20;
        uVar32 = (uint)(0 < (int)(local_a34 << (bVar12 & 0x1f)));
        uVar31 = uVar35;
        if ((int)uVar2 < (int)uVar35) {
          uVar31 = uVar2;
        }
        iVar30 = uVar32 + uVar31;
        lVar36 = (long)(int)(iVar20 - uVar32);
        uVar32 = uVar31;
        if ((int)uVar31 < 1) {
          uVar32 = 0;
        }
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        local_a18 = argb_scratch;
        puVar23 = argb_scratch + lVar15 + 1;
        for (lVar34 = 0; lVar34 != 0xe; lVar34 = lVar34 + 1) {
          if (0 < iVar27) {
            memcpy(puVar23 + lVar36,argb + lVar36 + (iVar27 + -1) * width,(long)iVar30 * 4 + 4);
          }
          puVar24 = puVar23;
          for (uVar8 = 0; puVar23 = puVar24, uVar8 != uVar29; uVar8 = uVar8 + 1) {
            lVar39 = uVar8 + (long)iVar27;
            bVar1 = lVar39 < (long)height + -1;
            memcpy(local_a18 + lVar36,argb + lVar36 + lVar39 * lVar15,
                   (long)(int)(iVar30 + (uint)bVar1) << 2);
            if (bVar1 && (0 < lVar39 && 1 < max_quantization)) {
              MaxDiffsForRow((uint)((int)uVar2 < (int)uVar35) + iVar30,width,
                             argb + lVar36 + lVar39 * lVar15,
                             (uint8_t *)((long)(argb_scratch + lVar15 * 2 + 2) + lVar36),
                             used_subtract_green);
            }
            GetResidual(width,height,puVar23,local_a18,(uint8_t *)(argb_scratch + lVar15 * 2 + 2),
                        (int)lVar34,iVar20,uVar31 + iVar20,(int)lVar39,max_quantization,exact,
                        used_subtract_green,local_838);
            for (uVar14 = 0; uVar32 != uVar14; uVar14 = uVar14 + 1) {
              UpdateHisto(puVar7 + lVar34 * 0x400,local_838[uVar14]);
            }
            if (min_bits < iVar5) {
              for (uVar22 = 1; uVar22 <= (uint)(iVar19 - min_bits); uVar22 = uVar22 + 1) {
                for (uVar14 = 0; uVar32 != uVar14; uVar14 = uVar14 + 1) {
                  UpdateHisto(puVar7 + (int)((uVar22 * 0xe + (int)lVar34) * 0x400),local_838[uVar14]
                             );
                }
              }
            }
            puVar24 = local_a18;
            local_a18 = puVar23;
          }
        }
        iVar20 = 0;
        iVar27 = 0;
        uVar29 = 0;
        while( true ) {
          bVar13 = (byte)uVar29;
          uVar31 = local_a34 >> (bVar13 & 0x1f);
          uVar32 = uVar25 >> (bVar13 & 0x1f);
          uVar35 = (uint)((1 << (bVar13 + bVar12 & 0x1f)) + iVar4) >> (bVar13 + bVar12 & 0x1f);
          puVar23 = ppuVar16[(int)uVar29];
          local_9c0 = 0xff;
          local_a20 = (uint8_t *)0xff;
          if (0 < (int)uVar31) {
            local_a20 = (uint8_t *)
                        (ulong)*(byte *)((long)puVar23 +
                                        (long)(int)(uVar35 * uVar32 + uVar31) * 4 + -3);
          }
          if (0 < (int)uVar32) {
            local_9c0 = (ulong)*(byte *)((long)puVar23 +
                                        (long)(int)((uVar32 - 1) * uVar35 + uVar31) * 4 + 1);
          }
          puVar24 = puVar7 + iVar20;
          iVar30 = uVar29 * 0x3800;
          uVar22 = 0;
          lVar36 = 0x7fffffffffffffff;
          local_a18 = puVar7;
          for (uVar8 = 0; uVar8 != 0xe; uVar8 = uVar8 + 1) {
            lVar39 = 0;
            for (lVar34 = 0; lVar34 != 0x1000; lVar34 = lVar34 + 0x400) {
              iVar9 = PredictionCostBias((uint32_t *)((long)puVar24 + lVar34),1,0x5e);
              uVar10 = (*VP8LCombinedShannonEntropy)
                                 ((uint32_t *)((long)puVar24 + lVar34),
                                  (uint32_t *)
                                  ((long)puVar7 +
                                  lVar34 + (long)iVar27 * 4 + (long)(iVar21 * 0x3800) * 4));
              lVar39 = uVar10 + iVar9 + lVar39;
            }
            lVar34 = lVar39 + -0x7800000;
            if ((uint8_t *)uVar8 != local_a20) {
              lVar34 = lVar39;
            }
            lVar39 = lVar34 + -0x7800000;
            if (uVar8 != local_9c0) {
              lVar39 = lVar34;
            }
            if (lVar39 < lVar36) {
              lVar36 = lVar39;
              uVar22 = (uint)uVar8;
              local_a18 = puVar7 + iVar30 + uVar8 * 0x400;
            }
            puVar24 = puVar24 + 0x400;
          }
          (*VP8LAddVectorEq)(local_a18,puVar7 + (long)(iVar21 * 0x3800) + (long)(int)(uVar29 << 10),
                             0x400);
          puVar23[(int)(uVar35 * uVar32 + uVar31)] = uVar22 << 8 | 0xff000000;
          puVar7[(long)(iVar21 * 0x3800) +
                 (long)(iVar21 * 0x400) + (long)(int)(uVar29 * 0xe) + (ulong)uVar22] =
               puVar7[(long)(iVar21 * 0x3800) +
                      (long)(iVar21 * 0x400) + (long)(int)(uVar29 * 0xe) + (ulong)uVar22] + 1;
          local_8e0 = uVar33 * 0x3800;
          uVar31 = uVar33;
          if (uVar29 == uVar33) break;
          uVar32 = uVar29 + 1;
          if (uVar32 <= uVar33 && (uint)(iVar19 - min_bits) < uVar32) {
            (*VP8LAddVectorEq)(puVar7 + iVar30,puVar7 + (int)(uVar32 * 0x3800),0x3800);
          }
          local_8e0 = iVar30;
          uVar31 = uVar29;
          if (((local_a34 != uVar26) &&
              ((-1 << ((byte)uVar32 & 0x1f) | 0x7ffffffe - local_9d0) != 0xffffffff)) ||
             ((uVar25 != uVar37 - 1 &&
              ((-1 << ((byte)uVar32 & 0x1f) | 0x7ffffffe - local_a38) != 0xffffffff)))) break;
          iVar27 = iVar27 + 0x400;
          iVar20 = iVar20 + 0x3800;
          uVar29 = uVar32;
        }
        memset(puVar7,0,(ulong)(local_8e0 + 0x3800) << 2);
        if (uVar31 == uVar33) {
          local_a38 = 0;
          local_9d4 = local_9d4 + 1;
          if (local_a34 == uVar26) {
            local_9d4 = 0;
          }
          iVar38 = iVar38 + (uint)(local_a34 == uVar26);
          local_9d0 = 0;
        }
        else {
          bVar13 = (byte)uVar31;
          local_9d0 = local_9d0 >> (bVar13 & 0x1f);
          local_a38 = local_a38 >> (bVar13 & 0x1f);
          if ((local_a34 == uVar26) && ((local_9d0 & 1) == 0)) {
LAB_0013aef2:
            local_a38 = local_a38 + 1;
          }
          else {
            if ((local_9d0 & 1) != 0) {
              local_9d0 = local_9d0 - 1;
              goto LAB_0013aef2;
            }
            local_9d0 = local_9d0 | 1;
          }
          local_9d0 = local_9d0 << (bVar13 & 0x1f);
          local_a38 = local_a38 << (bVar13 & 0x1f);
        }
        uVar25 = (iVar38 << ((byte)uVar33 & 0x1f)) + local_a38;
        local_a34 = (local_9d4 << ((byte)uVar33 & 0x1f)) + local_9d0;
      } while ((local_a34 != 0) ||
              (iVar20 = WebPReportProgress(pic,(uVar25 * percent_range) / uVar37 + iVar17,percent),
              iVar20 != 0));
      WebPSafeFree(puVar7);
      local_a00 = (uint32_t *)0x0;
LAB_0013b07a:
      if (*best_bits != 0) {
        bVar12 = (byte)*best_bits;
        iVar17 = 1 << (bVar12 & 0x1f);
        memcpy(image,local_a00,
               (ulong)(((uint)(iVar17 + iVar28) >> (bVar12 & 0x1f)) *
                      ((uint)(iVar17 + iVar4) >> (bVar12 & 0x1f))) << 2);
        WebPSafeFree(puVar6);
        max_bits = *best_bits;
        local_9a8 = 1 << ((byte)max_bits & 0x1f);
        local_9e8 = (uint)(iVar4 + local_9a8) >> ((byte)max_bits & 0x1f);
        goto LAB_0013a368;
      }
    }
    WebPSafeFree(puVar6);
  }
  return 0;
}

Assistant:

int VP8LResidualImage(int width, int height, int min_bits, int max_bits,
                      int low_effort, uint32_t* const argb,
                      uint32_t* const argb_scratch, uint32_t* const image,
                      int near_lossless_quality, int exact,
                      int used_subtract_green, const WebPPicture* const pic,
                      int percent_range, int* const percent,
                      int* const best_bits) {
  int percent_start = *percent;
  const int max_quantization = 1 << VP8LNearLosslessBits(near_lossless_quality);
  if (low_effort) {
    const int tiles_per_row = VP8LSubSampleSize(width, max_bits);
    const int tiles_per_col = VP8LSubSampleSize(height, max_bits);
    int i;
    for (i = 0; i < tiles_per_row * tiles_per_col; ++i) {
      image[i] = ARGB_BLACK | (kPredLowEffort << 8);
    }
    *best_bits = max_bits;
  } else {
    // Allocate data to try all samplings from min_bits to max_bits.
    int bits;
    uint32_t sum_num_pixels = 0u;
    uint32_t *modes_raw, *best_mode;
    uint32_t* modes[MAX_TRANSFORM_BITS + 1];
    uint32_t num_pixels[MAX_TRANSFORM_BITS + 1];
    for (bits = min_bits; bits <= max_bits; ++bits) {
      const int tiles_per_row = VP8LSubSampleSize(width, bits);
      const int tiles_per_col = VP8LSubSampleSize(height, bits);
      num_pixels[bits] = tiles_per_row * tiles_per_col;
      sum_num_pixels += num_pixels[bits];
    }
    modes_raw = (uint32_t*)WebPSafeMalloc(sum_num_pixels, sizeof(*modes_raw));
    if (modes_raw == NULL) return 0;
    // Have modes point to the right global memory modes_raw.
    modes[min_bits] = modes_raw;
    for (bits = min_bits + 1; bits <= max_bits; ++bits) {
      modes[bits] = modes[bits - 1] + num_pixels[bits - 1];
    }
    // Find the best sampling.
    GetBestPredictorsAndSubSampling(
        width, height, min_bits, max_bits, argb_scratch, argb, max_quantization,
        exact, used_subtract_green, pic, percent_range, percent,
        &modes[min_bits], best_bits, &best_mode);
    if (*best_bits == 0) {
      WebPSafeFree(modes_raw);
      return 0;
    }
    // Keep the best predictor image.
    memcpy(image, best_mode,
           VP8LSubSampleSize(width, *best_bits) *
               VP8LSubSampleSize(height, *best_bits) * sizeof(*image));
    WebPSafeFree(modes_raw);
  }

  CopyImageWithPrediction(width, height, *best_bits, image, argb_scratch, argb,
                          low_effort, max_quantization, exact,
                          used_subtract_green);
  return WebPReportProgress(pic, percent_start + percent_range, percent);
}